

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O0

int frame_codec_unsubscribe(FRAME_CODEC_HANDLE frame_codec,uint8_t type)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LIST_ITEM_HANDLE item_handle;
  void *__ptr;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  SUBSCRIPTION *subscription;
  LOGGER_LOG l_1;
  LIST_ITEM_HANDLE list_item;
  FRAME_CODEC_INSTANCE *frame_codec_data;
  LOGGER_LOG l;
  int result;
  uint8_t type_local;
  FRAME_CODEC_HANDLE frame_codec_local;
  
  l._7_1_ = type;
  _result = frame_codec;
  if (frame_codec == (FRAME_CODEC_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                ,"frame_codec_unsubscribe",0x216,1,"NULL frame_codec");
    }
    l._0_4_ = 0x217;
  }
  else {
    item_handle = singlylinkedlist_find
                            (frame_codec->subscription_list,find_subscription_by_frame_type,
                             (void *)((long)&l + 7));
    if (item_handle == (LIST_ITEM_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                  ,"frame_codec_unsubscribe",0x222,1,"Cannot find subscription for type %u",
                  (uint)l._7_1_);
      }
      l._0_4_ = 0x223;
    }
    else {
      __ptr = singlylinkedlist_item_get_value(item_handle);
      if (__ptr == (void *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                    ,"frame_codec_unsubscribe",0x22b,1,
                    "singlylinkedlist_item_get_value failed when unsubscribing");
        }
        l._0_4_ = 0x22c;
      }
      else {
        free(__ptr);
        iVar1 = singlylinkedlist_remove(frame_codec->subscription_list,item_handle);
        if (iVar1 == 0) {
          l._0_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                      ,"frame_codec_unsubscribe",0x234,1,"Cannot remove subscription from list");
          }
          l._0_4_ = 0x235;
        }
      }
    }
  }
  return (int)l;
}

Assistant:

int frame_codec_unsubscribe(FRAME_CODEC_HANDLE frame_codec, uint8_t type)
{
    int result;

    /* Codes_SRS_FRAME_CODEC_01_039: [If frame_codec is NULL, frame_codec_unsubscribe shall return a non-zero value.] */
    if (frame_codec == NULL)
    {
        LogError("NULL frame_codec");
        result = MU_FAILURE;
    }
    else
    {
        FRAME_CODEC_INSTANCE* frame_codec_data = (FRAME_CODEC_INSTANCE*)frame_codec;
        LIST_ITEM_HANDLE list_item = singlylinkedlist_find(frame_codec_data->subscription_list, find_subscription_by_frame_type, &type);

        if (list_item == NULL)
        {
            /* Codes_SRS_FRAME_CODEC_01_040: [If no subscription for the type frame type exists, frame_codec_unsubscribe shall return a non-zero value.] */
            /* Codes_SRS_FRAME_CODEC_01_041: [If any failure occurs while performing the unsubscribe operation, frame_codec_unsubscribe shall return a non-zero value.] */
            LogError("Cannot find subscription for type %u", (unsigned int)type);
            result = MU_FAILURE;
        }
        else
        {
            SUBSCRIPTION* subscription = (SUBSCRIPTION*)singlylinkedlist_item_get_value(list_item);
            if (subscription == NULL)
            {
                /* Codes_SRS_FRAME_CODEC_01_041: [If any failure occurs while performing the unsubscribe operation, frame_codec_unsubscribe shall return a non-zero value.] */
                LogError("singlylinkedlist_item_get_value failed when unsubscribing");
                result = MU_FAILURE;
            }
            else
            {
                free(subscription);
                if (singlylinkedlist_remove(frame_codec_data->subscription_list, list_item) != 0)
                {
                    /* Codes_SRS_FRAME_CODEC_01_041: [If any failure occurs while performing the unsubscribe operation, frame_codec_unsubscribe shall return a non-zero value.] */
                    LogError("Cannot remove subscription from list");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_FRAME_CODEC_01_038: [frame_codec_unsubscribe removes a previous subscription for frames of type type and on success it shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}